

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qradiobutton.cpp
# Opt level: O2

void __thiscall QRadioButton::initStyleOption(QRadioButton *this,QStyleOptionButton *option)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  QSize QVar5;
  byte bVar6;
  
  if (option != (QStyleOptionButton *)0x0) {
    lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
    QStyleOption::initFrom(&option->super_QStyleOption,(QWidget *)this);
    QString::operator=(&option->text,(QString *)(lVar1 + 600));
    QIcon::operator=(&option->icon,(QIcon *)(lVar1 + 0x270));
    QVar5 = QAbstractButton::iconSize(&this->super_QAbstractButton);
    option->iconSize = QVar5;
    bVar6 = *(byte *)(lVar1 + 0x28c);
    uVar4 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i;
    if ((bVar6 & 0x10) != 0) {
      uVar4 = uVar4 | 4;
      (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i = uVar4;
      bVar6 = *(byte *)(lVar1 + 0x28c);
    }
    uVar2 = 0x20;
    if ((bVar6 & 2) == 0) {
      uVar2 = 8;
    }
    (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i = uVar2 | uVar4;
    bVar3 = QWidget::testAttribute_helper((QWidget *)this,WA_Hover);
    if ((bVar3) &&
       ((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 2) != 0)) {
      (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (*(byte *)(lVar1 + 0x2b4) & 1) << 0xd |
           (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i & 0xffffdfff;
    }
  }
  return;
}

Assistant:

void QRadioButton::initStyleOption(QStyleOptionButton *option) const
{
    if (!option)
        return;
    Q_D(const QRadioButton);
    option->initFrom(this);
    option->text = d->text;
    option->icon = d->icon;
    option->iconSize = iconSize();
    if (d->down)
        option->state |= QStyle::State_Sunken;
    option->state |= (d->checked) ? QStyle::State_On : QStyle::State_Off;
    if (testAttribute(Qt::WA_Hover) && underMouse()) {
        option->state.setFlag(QStyle::State_MouseOver, d->hovering);
    }
}